

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O3

void jinit_color_deconverter(j_decompress_ptr cinfo)

{
  J_COLOR_SPACE JVar1;
  jpeg_error_mgr *pjVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  jpeg_color_deconverter *pjVar7;
  code *pcVar8;
  long lVar9;
  boolean *pbVar10;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  pjVar7 = (jpeg_color_deconverter *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x38);
  cinfo->cconvert = pjVar7;
  pjVar7->start_pass = start_pass_dcolor;
  JVar1 = cinfo->jpeg_color_space;
  if (JVar1 - JCS_RGB < 2) {
    if (cinfo->num_components != 3) goto LAB_00140f38;
  }
  else if (JVar1 - JCS_CMYK < 2) {
    if (cinfo->num_components != 4) goto LAB_00140f38;
  }
  else if (JVar1 == JCS_GRAYSCALE) {
    if (cinfo->num_components != 1) {
LAB_00140f38:
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 10;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
  }
  else if (cinfo->num_components < 1) goto LAB_00140f38;
  JVar1 = cinfo->out_color_space;
  uVar11 = (ulong)JVar1;
  if (JVar1 - JCS_EXT_RGB < 10) {
LAB_00140f52:
    cinfo->out_color_components = rgb_pixelsize[uVar11];
    JVar1 = cinfo->jpeg_color_space;
    if (JVar1 == JCS_GRAYSCALE) {
      pcVar8 = gray_rgb_convert;
    }
    else if (JVar1 == JCS_RGB) {
      if ((((0x10c4UL >> (uVar11 & 0x3f) & 1) != 0) && ((0x33c4UL >> (uVar11 & 0x3f) & 1) != 0)) &&
         ((0x144UL >> (uVar11 & 0x3f) & 1) != 0)) goto LAB_001411e5;
      pcVar8 = rgb_rgb_convert;
    }
    else {
      if (JVar1 != JCS_YCbCr) {
LAB_00141213:
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x1b;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
        goto LAB_00141222;
      }
      iVar6 = jsimd_can_ycc_rgb();
      if (iVar6 == 0) {
        pcVar8 = ycc_rgb_convert;
        goto LAB_001411d7;
      }
      pcVar8 = jsimd_ycc_rgb_convert;
    }
  }
  else {
    if ((int)JVar1 < 4) {
      if (JVar1 == JCS_GRAYSCALE) {
        cinfo->out_color_components = 1;
        JVar1 = cinfo->jpeg_color_space;
        if (JVar1 != JCS_YCbCr) {
          if (JVar1 == JCS_RGB) {
            pjVar7->color_convert = rgb_gray_convert;
            build_rgb_y_table(cinfo);
            goto LAB_00141222;
          }
          if (JVar1 != JCS_GRAYSCALE) goto LAB_00141213;
        }
        pjVar7->color_convert = grayscale_convert;
        auVar5 = _DAT_00161dd0;
        auVar4 = _DAT_00160a40;
        auVar3 = _DAT_00160a30;
        iVar6 = cinfo->num_components;
        if (1 < (long)iVar6) {
          lVar9 = (long)iVar6 + -2;
          auVar12._8_4_ = (int)lVar9;
          auVar12._0_8_ = lVar9;
          auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
          pbVar10 = &cinfo->comp_info[1].component_needed;
          uVar11 = 0;
          auVar12 = auVar12 ^ _DAT_00160a40;
          do {
            auVar14._8_4_ = (int)uVar11;
            auVar14._0_8_ = uVar11;
            auVar14._12_4_ = (int)(uVar11 >> 0x20);
            auVar15 = (auVar14 | auVar3) ^ auVar4;
            iVar13 = auVar12._4_4_;
            if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                        iVar13 < auVar15._4_4_) & 1)) {
              *pbVar10 = 0;
            }
            if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
                auVar15._12_4_ <= auVar12._12_4_) {
              pbVar10[0x18] = 0;
            }
            auVar14 = (auVar14 | auVar5) ^ auVar4;
            iVar16 = auVar14._4_4_;
            if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
              pbVar10[0x30] = 0;
              pbVar10[0x48] = 0;
            }
            uVar11 = uVar11 + 4;
            pbVar10 = pbVar10 + 0x60;
          } while ((iVar6 + 2U & 0xfffffffc) != uVar11);
        }
        goto LAB_00141222;
      }
      if (JVar1 != JCS_RGB) goto LAB_0014105a;
      goto LAB_00140f52;
    }
    if (JVar1 == JCS_CMYK) {
      cinfo->out_color_components = 4;
      if (cinfo->jpeg_color_space != JCS_CMYK) {
        if (cinfo->jpeg_color_space != JCS_YCCK) goto LAB_00141213;
        pcVar8 = ycck_cmyk_convert;
LAB_001411d7:
        pjVar7->color_convert = pcVar8;
        build_ycc_rgb_table(cinfo);
        goto LAB_00141222;
      }
LAB_001411e5:
      pcVar8 = null_convert;
    }
    else {
      if (JVar1 != JCS_RGB565) {
LAB_0014105a:
        if (JVar1 == cinfo->jpeg_color_space) {
          cinfo->out_color_components = cinfo->num_components;
          goto LAB_001411e5;
        }
        goto LAB_00141213;
      }
      cinfo->out_color_components = 3;
      JVar1 = cinfo->jpeg_color_space;
      if (cinfo->dither_mode == JDITHER_NONE) {
        if (JVar1 == JCS_GRAYSCALE) {
          pcVar8 = gray_rgb565_convert;
        }
        else if (JVar1 == JCS_RGB) {
          pcVar8 = rgb_rgb565_convert;
        }
        else {
          if (JVar1 != JCS_YCbCr) goto LAB_00141213;
          iVar6 = jsimd_can_ycc_rgb565();
          if (iVar6 == 0) {
            pcVar8 = ycc_rgb565_convert;
            goto LAB_001411d7;
          }
          pcVar8 = jsimd_ycc_rgb565_convert;
        }
      }
      else if (JVar1 == JCS_GRAYSCALE) {
        pcVar8 = gray_rgb565D_convert;
      }
      else {
        if (JVar1 != JCS_RGB) {
          if (JVar1 == JCS_YCbCr) {
            pcVar8 = ycc_rgb565D_convert;
            goto LAB_001411d7;
          }
          goto LAB_00141213;
        }
        pcVar8 = rgb_rgb565D_convert;
      }
    }
  }
  pjVar7->color_convert = pcVar8;
LAB_00141222:
  iVar6 = 1;
  if (cinfo->quantize_colors == 0) {
    iVar6 = cinfo->out_color_components;
  }
  cinfo->output_components = iVar6;
  return;
}

Assistant:

GLOBAL(void)
jinit_color_deconverter(j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert;
  int ci;

  cconvert = (my_cconvert_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_color_deconverter));
  cinfo->cconvert = (struct jpeg_color_deconverter *)cconvert;
  cconvert->pub.start_pass = start_pass_dcolor;

  /* Make sure num_components agrees with jpeg_color_space */
  switch (cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_RGB:
  case JCS_YCbCr:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  default:                      /* JCS_UNKNOWN can be anything */
    if (cinfo->num_components < 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;
  }

  /* Set out_color_components and conversion method based on requested space.
   * Also clear the component_needed flags for any unused components,
   * so that earlier pipeline stages can avoid useless computation.
   */

  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    if (cinfo->jpeg_color_space == JCS_GRAYSCALE ||
        cinfo->jpeg_color_space == JCS_YCbCr) {
      cconvert->pub.color_convert = grayscale_convert;
      /* For color->grayscale conversion, only the Y (0) component is needed */
      for (ci = 1; ci < cinfo->num_components; ci++)
        cinfo->comp_info[ci].component_needed = FALSE;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      cconvert->pub.color_convert = rgb_gray_convert;
      build_rgb_y_table(cinfo);
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    cinfo->out_color_components = rgb_pixelsize[cinfo->out_color_space];
    if (cinfo->jpeg_color_space == JCS_YCbCr) {
      if (jsimd_can_ycc_rgb())
        cconvert->pub.color_convert = jsimd_ycc_rgb_convert;
      else {
        cconvert->pub.color_convert = ycc_rgb_convert;
        build_ycc_rgb_table(cinfo);
      }
    } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
      cconvert->pub.color_convert = gray_rgb_convert;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      if (rgb_red[cinfo->out_color_space] == 0 &&
          rgb_green[cinfo->out_color_space] == 1 &&
          rgb_blue[cinfo->out_color_space] == 2 &&
          rgb_pixelsize[cinfo->out_color_space] == 3)
        cconvert->pub.color_convert = null_convert;
      else
        cconvert->pub.color_convert = rgb_rgb_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB565:
    cinfo->out_color_components = 3;
    if (cinfo->dither_mode == JDITHER_NONE) {
      if (cinfo->jpeg_color_space == JCS_YCbCr) {
        if (jsimd_can_ycc_rgb565())
          cconvert->pub.color_convert = jsimd_ycc_rgb565_convert;
        else {
          cconvert->pub.color_convert = ycc_rgb565_convert;
          build_ycc_rgb_table(cinfo);
        }
      } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
        cconvert->pub.color_convert = gray_rgb565_convert;
      } else if (cinfo->jpeg_color_space == JCS_RGB) {
        cconvert->pub.color_convert = rgb_rgb565_convert;
      } else
        ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    } else {
      /* only ordered dithering is supported */
      if (cinfo->jpeg_color_space == JCS_YCbCr) {
        cconvert->pub.color_convert = ycc_rgb565D_convert;
        build_ycc_rgb_table(cinfo);
      } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
        cconvert->pub.color_convert = gray_rgb565D_convert;
      } else if (cinfo->jpeg_color_space == JCS_RGB) {
        cconvert->pub.color_convert = rgb_rgb565D_convert;
      } else
        ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    }
    break;

  case JCS_CMYK:
    cinfo->out_color_components = 4;
    if (cinfo->jpeg_color_space == JCS_YCCK) {
      cconvert->pub.color_convert = ycck_cmyk_convert;
      build_ycc_rgb_table(cinfo);
    } else if (cinfo->jpeg_color_space == JCS_CMYK) {
      cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  default:
    /* Permit null conversion to same output space */
    if (cinfo->out_color_space == cinfo->jpeg_color_space) {
      cinfo->out_color_components = cinfo->num_components;
      cconvert->pub.color_convert = null_convert;
    } else                      /* unsupported non-null conversion */
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;
  }

  if (cinfo->quantize_colors)
    cinfo->output_components = 1; /* single colormapped output component */
  else
    cinfo->output_components = cinfo->out_color_components;
}